

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseLU_Memory.h
# Opt level: O1

int __thiscall
Eigen::internal::SparseLUImpl<double,_int>::memInit
          (SparseLUImpl<double,_int> *this,int m,int n,int annz,int lwork,int fillratio,
          int panel_size,GlobalLU_t *glu)

{
  Index *length;
  Index *length_00;
  Index *num_expansions;
  Index *length_01;
  int iVar1;
  int iVar2;
  long size;
  int iVar3;
  
  glu->num_expansions = 0;
  iVar1 = (fillratio * annz) / n;
  if (m <= iVar1) {
    iVar1 = m;
  }
  iVar1 = iVar1 * n;
  glu->nzlumax = iVar1;
  iVar3 = 4;
  if (4 < fillratio) {
    iVar3 = fillratio;
  }
  iVar3 = iVar3 * annz;
  iVar2 = iVar3 + 3;
  if (-1 < iVar3) {
    iVar2 = iVar3;
  }
  glu->nzumax = iVar1;
  glu->nzlmax = iVar2 >> 2;
  if (lwork == -1) {
    iVar1 = n * 0x15 + (panel_size + 1) * m * 8 + iVar1 * 0x14 +
            (panel_size * 2 + 7) * m * 4 + (iVar2 >> 2) * 4 + 0x14;
  }
  else {
    num_expansions = &glu->num_expansions;
    length = &glu->nzlumax;
    length_01 = &glu->nzumax;
    length_00 = &glu->nzlmax;
    size = (long)(n + 1);
    PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)glu,size);
    PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::resize
              (&(glu->supno).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>,size);
    PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::resize
              (&(glu->xlsub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>,size);
    PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::resize
              (&(glu->xlusup).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>,size);
    PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::resize
              (&(glu->xusub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>,size);
    do {
      iVar1 = SparseLUImpl<double,int>::expand<Eigen::Matrix<double,_1,1,0,_1,1>>
                        ((SparseLUImpl<double,int> *)this,&glu->lusup,length,0,0,num_expansions);
      if ((((iVar1 < 0) ||
           (iVar1 = SparseLUImpl<double,int>::expand<Eigen::Matrix<double,_1,1,0,_1,1>>
                              ((SparseLUImpl<double,int> *)this,&glu->ucol,length_01,0,0,
                               num_expansions), iVar1 < 0)) ||
          (iVar1 = SparseLUImpl<double,int>::expand<Eigen::Matrix<int,_1,1,0,_1,1>>
                             ((SparseLUImpl<double,int> *)this,&glu->lsub,length_00,0,0,
                              num_expansions), iVar1 < 0)) ||
         (iVar1 = SparseLUImpl<double,int>::expand<Eigen::Matrix<int,_1,1,0,_1,1>>
                            ((SparseLUImpl<double,int> *)this,&glu->usub,length_01,0,1,
                             num_expansions), iVar1 < 0)) {
        iVar1 = *length / 2;
        *length = iVar1;
        *length_01 = *length_01 / 2;
        *length_00 = *length_00 / 2;
        if (iVar1 < annz) {
          return iVar1;
        }
      }
    } while ((((glu->lusup).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
               .m_rows == 0) ||
             ((glu->ucol).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows == 0)) ||
            (((glu->lsub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows == 0 ||
             ((glu->usub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows == 0))));
    *num_expansions = *num_expansions + 1;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

Index SparseLUImpl<Scalar,Index>::memInit(Index m, Index n, Index annz, Index lwork, Index fillratio, Index panel_size,  GlobalLU_t& glu)
{
  Index& num_expansions = glu.num_expansions; //No memory expansions so far
  num_expansions = 0;
  glu.nzumax = glu.nzlumax = (std::min)(fillratio * annz / n, m) * n; // estimated number of nonzeros in U 
  glu.nzlmax = (std::max)(Index(4), fillratio) * annz / 4; // estimated  nnz in L factor
  // Return the estimated size to the user if necessary
  Index tempSpace;
  tempSpace = (2*panel_size + 4 + LUNoMarker) * m * sizeof(Index) + (panel_size + 1) * m * sizeof(Scalar);
  if (lwork == emptyIdxLU) 
  {
    Index estimated_size;
    estimated_size = (5 * n + 5) * sizeof(Index)  + tempSpace
                    + (glu.nzlmax + glu.nzumax) * sizeof(Index) + (glu.nzlumax+glu.nzumax) *  sizeof(Scalar) + n; 
    return estimated_size;
  }
  
  // Setup the required space 
  
  // First allocate Integer pointers for L\U factors
  glu.xsup.resize(n+1);
  glu.supno.resize(n+1);
  glu.xlsub.resize(n+1);
  glu.xlusup.resize(n+1);
  glu.xusub.resize(n+1);

  // Reserve memory for L/U factors
  do 
  {
    if(     (expand<ScalarVector>(glu.lusup, glu.nzlumax, 0, 0, num_expansions)<0)
        ||  (expand<ScalarVector>(glu.ucol,  glu.nzumax,  0, 0, num_expansions)<0)
        ||  (expand<IndexVector> (glu.lsub,  glu.nzlmax,  0, 0, num_expansions)<0)
        ||  (expand<IndexVector> (glu.usub,  glu.nzumax,  0, 1, num_expansions)<0) )
    {
      //Reduce the estimated size and retry
      glu.nzlumax /= 2;
      glu.nzumax /= 2;
      glu.nzlmax /= 2;
      if (glu.nzlumax < annz ) return glu.nzlumax; 
    }
  } while (!glu.lusup.size() || !glu.ucol.size() || !glu.lsub.size() || !glu.usub.size());
  
  ++num_expansions;
  return 0;
  
}